

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KmerCounter.cc
# Opt level: O2

ssize_t __thiscall KmerCounter::write(KmerCounter *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  ofstream count_file;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&count_file,
                 &this->name,".sdgkc");
  sdglib::write_string
            ((fstream *)CONCAT44(in_register_00000034,__fd),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&count_file);
  std::__cxx11::string::~string((string *)&count_file);
  std::operator+(&local_240,&this->name,".sdgkc");
  std::ofstream::ofstream(&count_file,(string *)&local_240,_S_out);
  std::__cxx11::string::~string((string *)&local_240);
  write_counts(this,&count_file);
  sVar1 = std::ofstream::~ofstream(&count_file);
  return sVar1;
}

Assistant:

void KmerCounter::write(std::fstream &output_file) const {
    sdglib::write_string(output_file, name+".sdgkc");
    std::ofstream count_file(name+".sdgkc");
    write_counts(count_file);
}